

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection2.c
# Opt level: O2

void ssh2_connection_process_queue(PacketProtocolLayer *ppl)

{
  Interactor **s;
  int iVar1;
  uint type;
  PktInQueue *pPVar2;
  Ssh *ssh;
  PacketLogSettings *pPVar3;
  _Bool _Var4;
  prompts_t *ppVar5;
  char *pcVar6;
  InteractionReadySeat IVar7;
  mainchan *pmVar8;
  PktIn *pPVar9;
  int *crLine;
  PktOutQueue *local_40;
  _func_void_SeatPromptResult_BinarySink_ptr *p_Stack_38;
  char *local_30;
  undefined8 uStack_28;
  
  s = &ppl[-3].interactor;
  _Var4 = ssh2_connection_filter_queue((ssh2_connection_state *)s);
  if (_Var4) {
    return;
  }
  iVar1 = *(int *)s;
  if (iVar1 == 0x413) goto LAB_001201b2;
  if (iVar1 == 0x3e9) {
LAB_00120114:
    IVar7 = ppl_get_iseat(ppl);
    (*(IVar7.seat)->vt->get_userpass_input)
              ((SeatPromptResult *)&local_40,IVar7.seat,(prompts_t *)ppl[-1].in_pq);
    ppl[-1].ic_process_queue.ctx = local_30;
    *(undefined8 *)&ppl[-1].ic_process_queue.queued = uStack_28;
    ppl[-1].out_pq = local_40;
    ppl[-1].ic_process_queue.fn = (toplevel_callback_fn_t)p_Stack_38;
    if (*(int *)&ppl[-1].out_pq == 0) {
      *(undefined4 *)s = 0x3e9;
      return;
    }
    free_prompts((prompts_t *)ppl[-1].in_pq);
    ppl[-1].in_pq = (PktInQueue *)0x0;
  }
  else {
    if (iVar1 != 0) {
      *(undefined4 *)s = 0;
      return;
    }
    if (ppl[-3].ssh != (Ssh *)0x0) {
      share_activate((ssh_sharing_state *)ppl[-3].ssh,*(char **)&ppl[-3].remote_bugs);
    }
    _Var4 = ssh2_connection_need_antispoof_prompt((ssh2_connection_state *)s);
    if (_Var4) {
      ppVar5 = ssh_ppl_new_prompts(ppl);
      ppl[-1].in_pq = (PktInQueue *)ppVar5;
      ppVar5->to_server = true;
      ppVar5->from_server = false;
      pcVar6 = dupstr("Authentication successful");
      ppVar5 = (prompts_t *)ppl[-1].in_pq;
      ppVar5->name = pcVar6;
      pcVar6 = dupstr("Access granted. Press Return to begin session. ");
      add_prompt(ppVar5,pcVar6,false);
      goto LAB_00120114;
    }
  }
  portfwdmgr_config((PortFwdManager *)ppl[-1].vt,(Conf *)ppl[-2].selfptr);
  *(undefined1 *)&ppl[-1].bpp = 1;
  pmVar8 = mainchan_new(ppl,(ConnectionLayer *)&ppl[-1].ssh,(Conf *)ppl[-2].selfptr,
                        *(int *)((long)&ppl[-2].out_pq + 4),*(int *)&ppl[-2].ic_process_queue.fn,
                        ppl[-2].ic_process_queue.queued,(SshChannel **)&ppl[-2].bpp);
  ppl[-2].vt = (PacketProtocolLayerVtable *)pmVar8;
  ppl[-2].ic_process_queue.field_0x12 = 1;
LAB_001201b2:
  ssh2_connection_filter_queue((ssh2_connection_state *)s);
  pPVar2 = ppl->in_pq;
  pPVar9 = (*pPVar2->after)(&pPVar2->pqb,(PacketQueueNode *)pPVar2,true);
  if (pPVar9 == (PktIn *)0x0) {
    *(undefined4 *)s = 0x413;
  }
  else {
    ssh = ppl->ssh;
    type = pPVar9->type;
    pPVar3 = ppl->bpp->pls;
    pcVar6 = ssh2_pkt_type(pPVar3->kctx,pPVar3->actx,type);
    ssh_proto_error(ssh,"Received unexpected connection-layer packet, type %d (%s)",(ulong)type,
                    pcVar6);
  }
  return;
}

Assistant:

static void ssh2_connection_process_queue(PacketProtocolLayer *ppl)
{
    struct ssh2_connection_state *s =
        container_of(ppl, struct ssh2_connection_state, ppl);
    PktIn *pktin;

    if (ssh2_connection_filter_queue(s)) /* no matter why we were called */
        return;

    crBegin(s->crState);

    if (s->connshare)
        share_activate(s->connshare, s->peer_verstring);

    /*
     * Signal the seat that authentication is done, so that it can
     * deploy spoofing defences. If it doesn't have any, deploy our
     * own fallback one.
     *
     * We do this here rather than at the end of userauth, because we
     * might not have gone through userauth at all (if we're a
     * connection-sharing downstream).
     */
    if (ssh2_connection_need_antispoof_prompt(s)) {
        s->antispoof_prompt = ssh_ppl_new_prompts(&s->ppl);
        s->antispoof_prompt->to_server = true;
        s->antispoof_prompt->from_server = false;
        s->antispoof_prompt->name = dupstr("Authentication successful");
        add_prompt(
            s->antispoof_prompt,
            dupstr("Access granted. Press Return to begin session. "), false);
        s->antispoof_ret = seat_get_userpass_input(
            ppl_get_iseat(&s->ppl), s->antispoof_prompt);
        while (s->antispoof_ret.kind == SPRK_INCOMPLETE) {
            crReturnV;
            s->antispoof_ret = seat_get_userpass_input(
                ppl_get_iseat(&s->ppl), s->antispoof_prompt);
        }
        free_prompts(s->antispoof_prompt);
        s->antispoof_prompt = NULL;
    }

    /*
     * Enable port forwardings.
     */
    portfwdmgr_config(s->portfwdmgr, s->conf);
    s->portfwdmgr_configured = true;

    /*
     * Create the main session channel, if any.
     */
    s->mainchan = mainchan_new(
        &s->ppl, &s->cl, s->conf, s->term_width, s->term_height,
        s->ssh_is_simple, &s->mainchan_sc);
    s->started = true;

    /*
     * Transfer data!
     */

    while (1) {
        if ((pktin = ssh2_connection_pop(s)) != NULL) {

            /*
             * _All_ the connection-layer packets we expect to
             * receive are now handled by the dispatch table.
             * Anything that reaches here must be bogus.
             */

            ssh_proto_error(s->ppl.ssh, "Received unexpected connection-layer "
                            "packet, type %d (%s)", pktin->type,
                            ssh2_pkt_type(s->ppl.bpp->pls->kctx,
                                          s->ppl.bpp->pls->actx,
                                          pktin->type));
            return;
        }
        crReturnV;
    }

    crFinishV;
}